

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginMainMenuBar(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiViewport *viewport_p;
  float fVar3;
  
  pIVar1 = GImGui;
  viewport_p = GetMainViewport();
  fVar3 = (pIVar1->Style).DisplaySafeAreaPadding.y - (pIVar1->Style).FramePadding.y;
  (pIVar1->NextWindowData).MenuBarOffsetMinVal.x = (pIVar1->Style).DisplaySafeAreaPadding.x;
  (pIVar1->NextWindowData).MenuBarOffsetMinVal.y = (float)(-(uint)(0.0 <= fVar3) & (uint)fVar3);
  fVar3 = GetFrameHeight();
  bVar2 = BeginViewportSideBar("##MainMenuBar",viewport_p,2,fVar3,0x508);
  (pIVar1->NextWindowData).MenuBarOffsetMinVal.x = 0.0;
  (pIVar1->NextWindowData).MenuBarOffsetMinVal.y = 0.0;
  if (bVar2) {
    BeginMenuBar();
  }
  else {
    End();
  }
  return bVar2;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)GetMainViewport();

    // For the main menu bar, which cannot be moved, we honor g.Style.DisplaySafeAreaPadding to ensure text can be visible on a TV set.
    // FIXME: This could be generalized as an opt-in way to clamp window->DC.CursorStartPos to avoid SafeArea?
    // FIXME: Consider removing support for safe area down the line... it's messy. Nowadays consoles have support for TV calibration in OS settings.
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    float height = GetFrameHeight();
    bool is_open = BeginViewportSideBar("##MainMenuBar", viewport, ImGuiDir_Up, height, window_flags);
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);

    if (is_open)
        BeginMenuBar();
    else
        End();
    return is_open;
}